

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O0

_Bool gravity_check_stack(gravity_vm *vm,gravity_fiber_t *fiber,uint32_t stacktopdelta,
                         gravity_value_t **stackstart)

{
  gravity_value_t *pgVar1;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  gravity_value_t *local_78;
  uint local_6c;
  gravity_upvalue_t *local_68;
  gravity_upvalue_t *upvalue;
  uint32_t i;
  ptrdiff_t offset;
  void *ptr;
  _Bool size_condition;
  uint32_t new_size;
  gravity_value_t *old_stack;
  uint32_t stack_needed;
  uint32_t stack_size;
  gravity_value_t **stackstart_local;
  uint32_t stacktopdelta_local;
  gravity_fiber_t *fiber_local;
  gravity_vm *vm_local;
  
  if (stacktopdelta == 0) {
    vm_local._7_1_ = true;
  }
  else {
    fiber->stacktop = fiber->stacktop + stacktopdelta;
    local_6c = (uint)((long)fiber->stacktop - (long)fiber->stack >> 4);
    if (local_6c < 0x101) {
      local_6c = 0x100;
    }
    if (fiber->stackalloc < local_6c) {
      pgVar1 = fiber->stack;
      uVar2 = power_of2_ceil(fiber->stackalloc + local_6c);
      bVar4 = false;
      if ((uVar2 != 0) && (bVar4 = false, fiber->stackalloc + local_6c <= uVar2)) {
        bVar4 = (ulong)uVar2 << 4 != -1;
      }
      if (bVar4) {
        local_78 = (gravity_value_t *)
                   gravity_realloc((gravity_vm *)0x0,fiber->stack,(ulong)uVar2 << 4);
      }
      else {
        local_78 = (gravity_value_t *)0x0;
      }
      if (local_78 == (gravity_value_t *)0x0) {
        fiber->stacktop = fiber->stacktop + -(ulong)stacktopdelta;
        vm_local._7_1_ = false;
      }
      else {
        fiber->stack = local_78;
        fiber->stackalloc = uVar2;
        if (fiber->stack == pgVar1) {
          vm_local._7_1_ = true;
        }
        else {
          lVar3 = (long)fiber->stack - (long)pgVar1 >> 4;
          for (upvalue._4_4_ = 0; upvalue._4_4_ < fiber->nframes; upvalue._4_4_ = upvalue._4_4_ + 1)
          {
            fiber->frames[upvalue._4_4_].stackstart =
                 fiber->frames[upvalue._4_4_].stackstart + lVar3;
          }
          for (local_68 = fiber->upvalues; local_68 != (gravity_upvalue_t *)0x0;
              local_68 = local_68->next) {
            local_68->value = local_68->value + lVar3;
          }
          fiber->stacktop = fiber->stacktop + lVar3;
          *stackstart = *stackstart + lVar3;
          vm_local._7_1_ = true;
        }
      }
    }
    else {
      vm_local._7_1_ = true;
    }
  }
  return vm_local._7_1_;
}

Assistant:

static inline bool gravity_check_stack (gravity_vm *vm, gravity_fiber_t *fiber, uint32_t stacktopdelta, gravity_value_t **stackstart) {
    #pragma unused(vm)
	if (stacktopdelta == 0) return true;
	
    // update stacktop pointer before a call
    fiber->stacktop += stacktopdelta;
	
    // check stack size
	uint32_t stack_size = (uint32_t)(fiber->stacktop - fiber->stack);
    uint32_t stack_needed = MAXNUM(stack_size, DEFAULT_MINSTACK_SIZE);
    if (fiber->stackalloc >= stack_needed) return true;
    gravity_value_t *old_stack = fiber->stack;

    // perform stack reallocation (power_of2_ceil returns 0 if argument is bigger than 2^31)
    uint32_t new_size = power_of2_ceil(fiber->stackalloc + stack_needed);
    bool size_condition = (new_size && (uint64_t)new_size >= (uint64_t)(fiber->stackalloc + stack_needed) && ((sizeof(gravity_value_t) * new_size) < SIZE_MAX));
    void *ptr = (size_condition) ? mem_realloc(NULL, fiber->stack, sizeof(gravity_value_t) * new_size) : NULL;
    if (!ptr) {
        // restore stacktop to previous state
        fiber->stacktop -= stacktopdelta;

        // stack reallocation failed means that there is a very high probability to be into an infinite loop
        // so return false and let the calling function (vm_exec) raise a runtime error
        return false;
    }
    
    fiber->stack = (gravity_value_t *)ptr;
    fiber->stackalloc = new_size;
    STAT_STACK_REALLOCATED(vm);

    // check if reallocation moved the stack
    if (fiber->stack == old_stack) return true;

    // re-compute ptr offset
    ptrdiff_t offset = (ptrdiff_t)(fiber->stack - old_stack);

    // adjust stack pointer for each call frame
    for (uint32_t i=0; i < fiber->nframes; ++i) {
        fiber->frames[i].stackstart += offset;
    }

    // adjust upvalues ptr offset
    gravity_upvalue_t *upvalue = fiber->upvalues;
    while (upvalue) {
        upvalue->value += offset;
        upvalue = upvalue->next;
    }

    // adjust fiber stack pointer
    fiber->stacktop += offset;

    // stack is changed so update currently used stackstart
    *stackstart += offset;

    return true;
}